

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryOptimizer.cpp
# Opt level: O1

Query * flatten_trivial_operations(Query *__return_storage_ptr__,Query *q,bool *changed)

{
  pointer pQVar1;
  pointer pQVar2;
  QueryType *pQVar3;
  vector<Query,_std::allocator<Query>_> *pvVar4;
  
  pQVar3 = Query::get_type(q);
  if (*pQVar3 == AND) {
    pvVar4 = Query::as_queries(q);
    if ((long)(pvVar4->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pvVar4->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
              super__Vector_impl_data._M_start != 0x48) goto LAB_00163683;
  }
  else {
LAB_00163683:
    pQVar3 = Query::get_type(q);
    if (*pQVar3 != OR) goto LAB_001636b4;
    pvVar4 = Query::as_queries(q);
    if ((long)(pvVar4->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pvVar4->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
              super__Vector_impl_data._M_start != 0x48) goto LAB_001636b4;
  }
  *changed = true;
  pvVar4 = Query::as_queries(q);
  q = (pvVar4->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.super__Vector_impl_data.
      _M_start;
LAB_001636b4:
  __return_storage_ptr__->type = q->type;
  pQVar1 = (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
  super__Vector_impl_data._M_start =
       (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
  super__Vector_impl_data._M_finish = pQVar1;
  (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  __return_storage_ptr__->count = q->count;
  __return_storage_ptr__->ngram = q->ngram;
  pQVar2 = (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
  super__Vector_impl_data._M_start =
       (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
  super__Vector_impl_data._M_finish = pQVar2;
  (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

Query flatten_trivial_operations(Query &&q, bool *changed) {
    if (q.get_type() == QueryType::AND && q.as_queries().size() == 1) {
        *changed = true;
        return std::move(q.as_queries()[0]);
    }
    if (q.get_type() == QueryType::OR && q.as_queries().size() == 1) {
        *changed = true;
        return std::move(q.as_queries()[0]);
    }
    return std::move(q);
}